

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

bool P_Thing_Projectile(int tid,AActor *source,int type,char *type_name,DAngle *angle,double speed,
                       double vspeed,int dest,AActor *forcedest,int gravity,int newtid,
                       bool leadTarget)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  PClassActor *type_00;
  AActor *pAVar5;
  double dVar6;
  double dVar7;
  bool local_219;
  TFlags<ActorFlag,_unsigned_int> local_208;
  TFlags<ActorFlag,_unsigned_int> local_204;
  undefined1 local_200 [4];
  TFlags<ActorFlag3,_unsigned_int> local_1fc;
  TFlags<ActorFlag,_unsigned_int> local_1f8;
  TFlags<ActorFlag2,_unsigned_int> local_1f4;
  TVector3<double> local_1f0;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [8];
  DVector3 aimvec;
  DMatrix3x3 rm;
  DVector3 rv;
  double sinb;
  double multiplier;
  double a;
  double local_110;
  double ydotx;
  double targspeed;
  double dist;
  undefined1 local_f0 [8];
  DVector3 tvel;
  DVector3 aim;
  DVector3 local_b8;
  subsector_t *local_a0;
  double z;
  FActorIterator tit;
  undefined1 local_80 [4];
  int defflags3;
  FActorIterator iterator;
  AActor *targ;
  AActor *mobj;
  AActor *spot;
  PClassActor *kind;
  int rtn;
  bool leadTarget_local;
  int dest_local;
  double vspeed_local;
  double speed_local;
  DAngle *angle_local;
  char *type_name_local;
  int type_local;
  AActor *source_local;
  int tid_local;
  
  source_local._7_1_ = false;
  iterator._8_8_ = forcedest;
  FActorIterator::FActorIterator((FActorIterator *)local_80,tid);
  if (type_name == (char *)0x0) {
    spot = (AActor *)P_GetSpawnableType(type);
  }
  else {
    spot = (AActor *)PClass::FindActor(type_name);
  }
  if (spot == (AActor *)0x0) {
    source_local._7_1_ = false;
  }
  else {
    type_00 = PClassActor::GetReplacement((PClassActor *)spot,true);
    pAVar5 = GetDefaultByType(&type_00->super_PClass);
    tit._12_4_ = TFlags::operator_cast_to_unsigned_int((TFlags *)&pAVar5->flags3);
    if (((tit._12_4_ & 0x2000) == 0) ||
       ((uVar3 = FIntCVar::operator_cast_to_int(&dmflags), (uVar3 & 0x1000) == 0 &&
        ((level.flags2 & 0x8000) == 0)))) {
      mobj = source;
      if (tid != 0) {
        mobj = FActorIterator::Next((FActorIterator *)local_80);
      }
      while (mobj != (AActor *)0x0) {
        FActorIterator::FActorIterator((FActorIterator *)&z,dest);
        if ((dest == 0) ||
           (iterator._8_8_ = FActorIterator::Next((FActorIterator *)&z),
           (AActor *)iterator._8_8_ != (AActor *)0x0)) {
          do {
            local_a0 = (subsector_t *)AActor::Z(mobj);
            if ((tit._12_4_ & 1) == 0) {
              if ((tit._12_4_ & 2) == 0) {
                if (((double)local_a0 != -2147483648.0) || (NAN((double)local_a0))) {
                  local_a0 = (subsector_t *)((double)local_a0 - mobj->Floorclip);
                }
              }
              else {
                local_a0 = (subsector_t *)0x41dfffffffc00000;
              }
            }
            else {
              local_a0 = (subsector_t *)0xc1e0000000000000;
            }
            AActor::PosAtZ(&local_b8,mobj,(double)local_a0);
            pAVar5 = Spawn(type_00,&local_b8,ALLOW_REPLACE);
            if (pAVar5 != (AActor *)0x0) {
              pAVar5->tid = newtid;
              AActor::AddToHash(pAVar5);
              P_PlaySpawnSound(pAVar5,mobj);
              iVar1 = (int)pAVar5;
              if (gravity == 0) {
                TFlags<ActorFlag,_unsigned_int>::operator|=(&pAVar5->flags,MF_NOGRAVITY);
              }
              else {
                operator~((int)&aim + (MF_NOBLOCKMAP|MF_SHOOTABLE));
                TFlags<ActorFlag,_unsigned_int>::operator&=
                          (&pAVar5->flags,(Self *)((long)&aim.Z + 4));
                TFlags<ActorFlag3,_unsigned_int>::operator&
                          ((TFlags<ActorFlag3,_unsigned_int> *)&aim.Z,
                           iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG)
                          );
                uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&aim.Z);
                local_219 = uVar3 == 0 && gravity == 1;
                if (local_219) {
                  pAVar5->Gravity = 0.125;
                }
              }
              TObjPtr<AActor>::operator=(&pAVar5->target,mobj);
              if (iterator._8_8_ == 0) {
                TAngle<double>::operator=(&(pAVar5->Angles).Yaw,angle);
                AActor::VelFromAngle(pAVar5,speed);
                (pAVar5->Vel).Z = vspeed;
              }
              else {
                AActor::Vec3To((DVector3 *)&tvel.Z,pAVar5,(AActor *)iterator._8_8_);
                aim.Y = *(double *)(iterator._8_8_ + 0x180) / 2.0 + aim.Y;
                if (((!leadTarget) || (speed <= 0.0)) ||
                   (bVar2 = TVector3<double>::isZero((TVector3<double> *)(iterator._8_8_ + 200)),
                   bVar2)) {
LAB_00609315:
                  AActor::AngleTo((AActor *)local_1d8,pAVar5,iterator.id._0_1_);
                  TAngle<double>::operator=(&(pAVar5->Angles).Yaw,(TAngle<double> *)local_1d8);
                  TVector3<double>::Resized(&local_1f0,(TVector3<double> *)&tvel.Z,speed);
                  TVector3<double>::operator=(&pAVar5->Vel,&local_1f0);
                }
                else {
                  TVector3<double>::TVector3
                            ((TVector3<double> *)local_f0,(TVector3<double> *)(iterator._8_8_ + 200)
                            );
                  TFlags<ActorFlag,_unsigned_int>::operator&
                            ((TFlags<ActorFlag,_unsigned_int> *)((long)&dist + 4),
                             iterator.id +
                             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                             MF_SHOOTABLE));
                  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&dist + 4));
                  bVar2 = false;
                  if (uVar3 == 0) {
                    bVar2 = *(int *)(iterator._8_8_ + 0x2d0) < 3;
                  }
                  if (bVar2) {
                    tvel.Y = 0.0;
                    if (((*(double *)(iterator._8_8_ + 200) == 0.0) &&
                        (!NAN(*(double *)(iterator._8_8_ + 200)))) &&
                       ((*(double *)(iterator._8_8_ + 0xd0) == 0.0 &&
                        (!NAN(*(double *)(iterator._8_8_ + 0xd0)))))) goto LAB_00609315;
                  }
                  targspeed = TVector3<double>::Length((TVector3<double> *)&tvel.Z);
                  ydotx = TVector3<double>::Length((TVector3<double> *)local_f0);
                  TVector3<double>::operator-((TVector3<double> *)&a,(TVector3<double> *)&tvel.Z);
                  local_110 = TVector3<double>::operator|
                                        ((TVector3<double> *)&a,(TVector3<double> *)local_f0);
                  dVar6 = clamp<double>((local_110 / ydotx) / targspeed,-1.0,1.0);
                  dVar6 = c_acos(dVar6);
                  iVar4 = FRandom::Random2(&pr_leadtarget);
                  dVar7 = ydotx * (((double)iVar4 * 0.1) / 255.0 + 1.1);
                  dVar6 = fastsin(dVar6);
                  dVar6 = clamp<double>((dVar7 * dVar6) / speed,-1.0,1.0);
                  TVector3<double>::operator^
                            ((TVector3<double> *)(rm.Cells[2] + 2),(TVector3<double> *)local_f0,
                             (TVector3<double> *)&tvel.Z);
                  TVector3<double>::MakeUnit((TVector3<double> *)(rm.Cells[2] + 2));
                  dVar7 = c_asin(-dVar6);
                  dVar7 = fastcos(dVar7);
                  TMatrix3x3<double>::TMatrix3x3
                            ((TMatrix3x3<double> *)&aimvec.Z,(Vector3 *)(rm.Cells[2] + 2),dVar7,
                             -dVar6);
                  operator*((Vector3 *)local_1b8,(TMatrix3x3<double> *)&aimvec.Z,(Vector3 *)&tvel.Z)
                  ;
                  operator*((TVector3<double> *)(local_1d8 + 8),(TVector3<double> *)local_1b8,
                            speed / targspeed);
                  TVector3<double>::operator=(&pAVar5->Vel,(TVector3<double> *)(local_1d8 + 8));
                  AActor::AngleFromVel(pAVar5);
                }
                TFlags<ActorFlag2,_unsigned_int>::operator&
                          (&local_1f4,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1f4);
                if (uVar3 != 0) {
                  TObjPtr<AActor>::operator=(&pAVar5->tracer,(AActor *)iterator._8_8_);
                }
              }
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_1f8,
                         iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                  MF_NOSECTOR|MF_SHOOTABLE));
              uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1f8);
              if (uVar3 != 0) {
                dVar6 = AActor::VelToSpeed(pAVar5);
                pAVar5->Speed = dVar6;
              }
              operator|((EnumType)local_200,MF3_FLOORHUGGER);
              TFlags<ActorFlag3,_unsigned_int>::operator&(&local_1fc,&pAVar5->flags3);
              uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1fc);
              if (uVar3 != 0) {
                (pAVar5->Vel).Z = 0.0;
              }
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_204,
                         iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                  MF_NOSECTOR|MF_SHOOTABLE));
              uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_204);
              if (uVar3 != 0) {
                TFlags<ActorFlag,_unsigned_int>::operator|=(&pAVar5->flags,MF_DROPPED);
              }
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_208,
                         iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                  MF_NOSECTOR|MF_SHOOTABLE));
              uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_208);
              if (uVar3 == 0) {
                bVar2 = P_TestMobjLocation(pAVar5);
                if (bVar2) {
                  source_local._7_1_ = true;
                }
                else {
                  AActor::ClearCounters(pAVar5);
                  (*(pAVar5->super_DThinker).super_DObject._vptr_DObject[4])();
                }
              }
              else {
                bVar2 = P_CheckMissileSpawn(pAVar5,mobj->radius);
                if (bVar2) {
                  source_local._7_1_ = true;
                }
              }
            }
            bVar2 = false;
            if (dest != 0) {
              iterator._8_8_ = FActorIterator::Next((FActorIterator *)&z);
              bVar2 = (AActor *)iterator._8_8_ != (AActor *)0x0;
            }
          } while (bVar2);
        }
        mobj = FActorIterator::Next((FActorIterator *)local_80);
      }
    }
    else {
      source_local._7_1_ = false;
    }
  }
  return source_local._7_1_;
}

Assistant:

bool P_Thing_Projectile (int tid, AActor *source, int type, const char *type_name, DAngle angle,
	double speed, double vspeed, int dest, AActor *forcedest, int gravity, int newtid,
	bool leadTarget)
{
	int rtn = 0;
	PClassActor *kind;
	AActor *spot, *mobj, *targ = forcedest;
	FActorIterator iterator (tid);
	int defflags3;

	if (type_name == NULL)
	{
		kind = P_GetSpawnableType(type);
	}
	else
	{
		kind = PClass::FindActor(type_name);
	}
	if (kind == NULL)
	{
		return false;
	}

	// Handle decorate replacements.
	kind = kind->GetReplacement();

	defflags3 = GetDefaultByType(kind)->flags3;
	if ((defflags3 & MF3_ISMONSTER) && 
		((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		return false;

	if (tid == 0)
	{
		spot = source;
	}
	else
	{
		spot = iterator.Next();
	}
	while (spot != NULL)
	{
		FActorIterator tit (dest);

		if (dest == 0 || (targ = tit.Next()))
		{
			do
			{
				double z = spot->Z();
				if (defflags3 & MF3_FLOORHUGGER)
				{
					z = ONFLOORZ;
				}
				else if (defflags3 & MF3_CEILINGHUGGER)
				{
					z = ONCEILINGZ;
				}
				else if (z != ONFLOORZ)
				{
					z -= spot->Floorclip;
				}
				mobj = Spawn (kind, spot->PosAtZ(z), ALLOW_REPLACE);

				if (mobj)
				{
					mobj->tid = newtid;
					mobj->AddToHash ();
					P_PlaySpawnSound(mobj, spot);
					if (gravity)
					{
						mobj->flags &= ~MF_NOGRAVITY;
						if (!(mobj->flags3 & MF3_ISMONSTER) && gravity == 1)
						{
							mobj->Gravity = 1./8;
						}
					}
					else
					{
						mobj->flags |= MF_NOGRAVITY;
					}
					mobj->target = spot;

					if (targ != NULL)
					{
						DVector3 aim = mobj->Vec3To(targ);
						aim.Z += targ->Height / 2;

						if (leadTarget && speed > 0 && !targ->Vel.isZero())
						{
							// Aiming at the target's position some time in the future
							// is basically just an application of the law of sines:
							//     a/sin(A) = b/sin(B)
							// Thanks to all those on the notgod phorum for helping me
							// with the math. I don't think I would have thought of using
							// trig alone had I been left to solve it by myself.

							DVector3 tvel = targ->Vel;
							if (!(targ->flags & MF_NOGRAVITY) && targ->waterlevel < 3)
							{ // If the target is subject to gravity and not underwater,
							  // assume that it isn't moving vertically. Thanks to gravity,
							  // even if we did consider the vertical component of the target's
							  // velocity, we would still miss more often than not.
								tvel.Z = 0.0;
								if (targ->Vel.X == 0 && targ->Vel.Y == 0)
								{
									goto nolead;
								}
							}
							double dist = aim.Length();
							double targspeed = tvel.Length();
							double ydotx = -aim | tvel;
							double a = g_acos (clamp (ydotx / targspeed / dist, -1.0, 1.0));
							double multiplier = double(pr_leadtarget.Random2())*0.1/255+1.1;
							double sinb = -clamp (targspeed*multiplier * g_sin(a) / speed, -1.0, 1.0);

							// Use the cross product of two of the triangle's sides to get a
							// rotation vector.
							DVector3 rv(tvel ^ aim);
							// The vector must be normalized.
							rv.MakeUnit();
							// Now combine the rotation vector with angle b to get a rotation matrix.
							DMatrix3x3 rm(rv, g_cos(g_asin(sinb)), sinb);
							// And multiply the original aim vector with the matrix to get a
							// new aim vector that leads the target.
							DVector3 aimvec = rm * aim;
							// And make the projectile follow that vector at the desired speed.
							mobj->Vel = aimvec * (speed / dist);
							mobj->AngleFromVel();
						}
						else
						{
nolead:
							mobj->Angles.Yaw = mobj->AngleTo(targ);
							mobj->Vel = aim.Resized (speed);
						}
						if (mobj->flags2 & MF2_SEEKERMISSILE)
						{
							mobj->tracer = targ;
						}
					}
					else
					{
						mobj->Angles.Yaw = angle;
						mobj->VelFromAngle(speed);
						mobj->Vel.Z = vspeed;
					}
					// Set the missile's speed to reflect the speed it was spawned at.
					if (mobj->flags & MF_MISSILE)
					{
						mobj->Speed = mobj->VelToSpeed();
					}
					// Hugger missiles don't have any vertical velocity
					if (mobj->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
					{
						mobj->Vel.Z = 0;
					}
					if (mobj->flags & MF_SPECIAL)
					{
						mobj->flags |= MF_DROPPED;
					}
					if (mobj->flags & MF_MISSILE)
					{
						if (P_CheckMissileSpawn (mobj, spot->radius))
						{
							rtn = true;
						}
					}
					else if (!P_TestMobjLocation (mobj))
					{
						// If this is a monster, subtract it from the total monster
						// count, because it already added to it during spawning.
						mobj->ClearCounters();
						mobj->Destroy ();
					}
					else
					{
						// It spawned fine.
						rtn = 1;
					}
				}
			} while (dest != 0 && (targ = tit.Next()));
		}
		spot = iterator.Next();
	}

	return rtn != 0;
}